

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateProtoLdFldFromFlagInlineCache
          (Lowerer *this,Instr *insertBeforeInstr,Opnd *opndDst,RegOpnd *opndInlineCache,
          LabelInstr *labelFallThru,bool isInlineSlot)

{
  BYTE BVar1;
  DWORD offset;
  IndirOpnd *pIVar2;
  RegOpnd *baseOpnd;
  RegOpnd *indexOpnd;
  Opnd *slotIndexOpnd;
  RegOpnd *opndSlotIndex;
  RegOpnd *opndObject;
  RegOpnd *opndObjSlots;
  IndirOpnd *opndIndir;
  Opnd *inlineCacheObjOpnd;
  bool isInlineSlot_local;
  LabelInstr *labelFallThru_local;
  RegOpnd *opndInlineCache_local;
  Opnd *opndDst_local;
  Instr *insertBeforeInstr_local;
  Lowerer *this_local;
  
  opndObject = (RegOpnd *)0x0;
  pIVar2 = IR::IndirOpnd::New(opndInlineCache,0,TyInt64,this->m_func,false);
  baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  InsertMove(&baseOpnd->super_Opnd,&pIVar2->super_Opnd,insertBeforeInstr,false);
  if (!isInlineSlot) {
    opndObject = IR::RegOpnd::New(TyInt64,this->m_func);
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar2 = IR::IndirOpnd::New(baseOpnd,offset,TyInt64,this->m_func,false);
    InsertMove(&opndObject->super_Opnd,&pIVar2->super_Opnd,insertBeforeInstr,false);
  }
  indexOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar2 = IR::IndirOpnd::New(opndInlineCache,10,TyUint16,this->m_func,false);
  InsertMove(&indexOpnd->super_Opnd,&pIVar2->super_Opnd,insertBeforeInstr,false);
  if (isInlineSlot) {
    BVar1 = LowererMD::GetDefaultIndirScale();
    opndObjSlots = (RegOpnd *)IR::IndirOpnd::New(baseOpnd,indexOpnd,BVar1,TyInt64,this->m_func);
  }
  else {
    BVar1 = LowererMD::GetDefaultIndirScale();
    opndObjSlots = (RegOpnd *)IR::IndirOpnd::New(opndObject,indexOpnd,BVar1,TyInt64,this->m_func);
  }
  InsertMove(opndDst,&opndObjSlots->super_Opnd,insertBeforeInstr,false);
  InsertBranch(Br,labelFallThru,insertBeforeInstr);
  return;
}

Assistant:

void
Lowerer::GenerateProtoLdFldFromFlagInlineCache(
    IR::Instr * insertBeforeInstr,
    IR::Opnd * opndDst,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelFallThru,
    bool isInlineSlot)
{
    // Generate:
    //
    // s1 = MOV [&(inlineCache->u.accessor.object)] -- load the cached prototype object
    // s1 = MOV [&s1->slots] -- load the slot array
    // s2 = MOVZXW [&(inlineCache->u.accessor.slotIndex)] -- load the cached slot index
    // dst = MOV [s1 + s2*4]
    //      JMP $fallthru

    IR::Opnd* inlineCacheObjOpnd;
    IR::IndirOpnd * opndIndir;
    IR::RegOpnd * opndObjSlots = nullptr;

    inlineCacheObjOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.object), TyMachReg, this->m_func);

    // s1 = MOV [&(inlineCache->u.accessor.object)] -- load the cached prototype object
    IR::RegOpnd *opndObject = IR::RegOpnd::New(TyMachReg, this->m_func);
    InsertMove(opndObject, inlineCacheObjOpnd, insertBeforeInstr, false);

    if (!isInlineSlot)
    {
        // s1 = MOV [&s1->slots] -- load the slot array
        opndObjSlots = IR::RegOpnd::New(TyMachReg, this->m_func);
        opndIndir = IR::IndirOpnd::New(opndObject, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, this->m_func);
        InsertMove(opndObjSlots, opndIndir, insertBeforeInstr, false);
    }

    // s2 = MOVZXW [&(inlineCache->u.accessor.slotIndex)] -- load the cached slot index
    IR::RegOpnd *opndSlotIndex = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::Opnd* slotIndexOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.slotIndex), TyUint16, this->m_func);
    InsertMove(opndSlotIndex, slotIndexOpnd, insertBeforeInstr, false);

    if (isInlineSlot)
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndObject, opndSlotIndex, m_lowererMD.GetDefaultIndirScale(), TyMachReg, this->m_func);
    }
    else
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndObjSlots, opndSlotIndex, m_lowererMD.GetDefaultIndirScale(), TyMachReg, this->m_func);
    }
    InsertMove(opndDst, opndIndir, insertBeforeInstr, false);

    // JMP $fallthru
    InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
}